

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O0

size_t ZSTD_decompress(void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  ZSTD_customMem customMem;
  ZSTD_DCtx *dctx_00;
  void *in_stack_ffffffffffffffc0;
  ZSTD_DCtx *dctx;
  size_t regenSize;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  
  customMem.opaque = in_stack_ffffffffffffffc0;
  customMem.customAlloc = (ZSTD_allocFunction)0x0;
  customMem.customFree = (ZSTD_freeFunction)0x0;
  dctx_00 = ZSTD_createDCtx_internal(customMem);
  if (dctx_00 == (ZSTD_DCtx *)0x0) {
    dst_local = (void *)0xffffffffffffffc0;
  }
  else {
    dst_local = (void *)ZSTD_decompressDCtx(dctx_00,dst,dstCapacity,src,srcSize);
    ZSTD_freeDCtx(dctx_00);
  }
  return (size_t)dst_local;
}

Assistant:

size_t ZSTD_decompress(void* dst, size_t dstCapacity, const void* src, size_t srcSize)
{
#if defined(ZSTD_HEAPMODE) && (ZSTD_HEAPMODE>=1)
    size_t regenSize;
    ZSTD_DCtx* const dctx =  ZSTD_createDCtx_internal(ZSTD_defaultCMem);
    RETURN_ERROR_IF(dctx==NULL, memory_allocation, "NULL pointer!");
    regenSize = ZSTD_decompressDCtx(dctx, dst, dstCapacity, src, srcSize);
    ZSTD_freeDCtx(dctx);
    return regenSize;
#else   /* stack mode */
    ZSTD_DCtx dctx;
    ZSTD_initDCtx_internal(&dctx);
    return ZSTD_decompressDCtx(&dctx, dst, dstCapacity, src, srcSize);
#endif
}